

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O3

void __thiscall YAML::Stream::AdvanceCurrent(Stream *this)

{
  _Map_pointer ppcVar1;
  _Elt_pointer pcVar2;
  _Elt_pointer pcVar3;
  
  pcVar2 = (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  pcVar3 = pcVar2;
  if (pcVar2 != (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur) {
    std::deque<char,_std::allocator<char>_>::pop_front(&this->m_readahead);
    (this->m_mark).pos = (this->m_mark).pos + 1;
    pcVar2 = (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    pcVar3 = (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
  }
  ppcVar1 = (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  if ((this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
      super__Deque_impl_data._M_start._M_last +
      (long)(pcVar3 + (((((ulong)((long)ppcVar1 -
                                 (long)(this->m_readahead).
                                       super__Deque_base<char,_std::allocator<char>_>._M_impl.
                                       super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                       (ulong)(ppcVar1 == (_Map_pointer)0x0)) * 0x200 -
                      (long)(this->m_readahead).super__Deque_base<char,_std::allocator<char>_>.
                            _M_impl.super__Deque_impl_data._M_finish._M_first)) == pcVar2) {
    _ReadAheadTo(this,0);
    return;
  }
  return;
}

Assistant:

void Stream::AdvanceCurrent() {
  if (!m_readahead.empty()) {
    m_readahead.pop_front();
    m_mark.pos++;
  }

  ReadAheadTo(0);
}